

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O3

void end_pass(stagewise_poly *poly)

{
  ulong uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  ulong uVar5;
  ulong uVar6;
  vw *all;
  ulong uVar7;
  float fVar8;
  float fVar9;
  
  if (poly->batch_sz != 0) {
    return;
  }
  all = poly->all;
  uVar1 = poly->numpasses;
  if (all->all_reduce == (AllReduce *)0x0 || uVar1 < 2) {
    uVar2 = poly->sum_sparsity_sync;
    uVar5 = poly->sum_sparsity - uVar2;
    uVar3 = poly->sum_input_sparsity_sync;
    uVar7 = poly->sum_input_sparsity - uVar3;
    uVar4 = poly->num_examples_sync;
    uVar6 = poly->num_examples - uVar4;
    if (all->all_reduce != (AllReduce *)0x0) {
      all_reduce<unsigned_char,_&reduce_min_max>
                (all,poly->depthsbits,2L << ((byte)all->num_bits & 0x3f));
      fVar8 = accumulate_scalar(all,(float)uVar7);
      fVar9 = accumulate_scalar(all,(float)uVar5);
      uVar7 = (long)fVar8 | (long)(fVar8 - 9.223372e+18) & (long)fVar8 >> 0x3f;
      uVar5 = (long)fVar9 | (long)(fVar9 - 9.223372e+18) & (long)fVar9 >> 0x3f;
      fVar8 = accumulate_scalar(all,(float)uVar6);
      uVar6 = (long)(fVar8 - 9.223372e+18) & (long)fVar8 >> 0x3f | (long)fVar8;
      uVar3 = poly->sum_input_sparsity_sync;
      all = poly->all;
      uVar2 = poly->sum_sparsity_sync;
      uVar4 = poly->num_examples_sync;
      uVar1 = poly->numpasses;
    }
    poly->sum_input_sparsity_sync = uVar3 + uVar7;
    poly->sum_input_sparsity = uVar3 + uVar7;
    poly->sum_sparsity_sync = uVar2 + uVar5;
    poly->sum_sparsity = uVar2 + uVar5;
    poly->num_examples_sync = uVar4 + uVar6;
    poly->num_examples = uVar4 + uVar6;
    if (uVar1 != all->numpasses) {
      poly->update_support = true;
      poly->numpasses = uVar1 + 1;
    }
  }
  return;
}

Assistant:

void end_pass(stagewise_poly &poly)
{
  if (!!poly.batch_sz || (poly.all->all_reduce != nullptr && poly.numpasses > 1))
    return;

  uint64_t sum_sparsity_inc = poly.sum_sparsity - poly.sum_sparsity_sync;
  uint64_t sum_input_sparsity_inc = poly.sum_input_sparsity - poly.sum_input_sparsity_sync;
  uint64_t num_examples_inc = poly.num_examples - poly.num_examples_sync;

#ifdef DEBUG
  cout << "Sanity before allreduce\n";
  sanity_check_state(poly);
#endif  // DEBUG

  vw &all = *poly.all;
  if (all.all_reduce != nullptr)
  {
    /*
     * The following is inconsistent with the transplant code in
     * synthetic_create_rec(), which clears parent bits on depth mismatches.
     * But it's unclear what the right behavior is in general for either
     * case...
     */
    all_reduce<uint8_t, reduce_min_max>(all, poly.depthsbits, depthsbits_sizeof(poly));

    sum_input_sparsity_inc = (uint64_t)accumulate_scalar(all, (float)sum_input_sparsity_inc);
    sum_sparsity_inc = (uint64_t)accumulate_scalar(all, (float)sum_sparsity_inc);
    num_examples_inc = (uint64_t)accumulate_scalar(all, (float)num_examples_inc);
  }

  poly.sum_input_sparsity_sync = poly.sum_input_sparsity_sync + sum_input_sparsity_inc;
  poly.sum_input_sparsity = poly.sum_input_sparsity_sync;
  poly.sum_sparsity_sync = poly.sum_sparsity_sync + sum_sparsity_inc;
  poly.sum_sparsity = poly.sum_sparsity_sync;
  poly.num_examples_sync = poly.num_examples_sync + num_examples_inc;
  poly.num_examples = poly.num_examples_sync;

#ifdef DEBUG
  cout << "Sanity after allreduce\n";
  sanity_check_state(poly);
#endif  // DEBUG

  if (poly.numpasses != poly.all->numpasses)
  {
    poly.update_support = true;
    poly.numpasses++;
  }
}